

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

size_t ftxui::GlyphNext(string *input,size_t start)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  ulong start_00;
  ulong uVar5;
  uint32_t codepoint;
  size_t end;
  uint32_t local_3c;
  size_t local_38;
  
  uVar1 = input->_M_string_length;
  bVar2 = 0;
LAB_0010bc40:
  do {
    bVar4 = bVar2;
    start_00 = start;
    uVar5 = uVar1;
    if (uVar1 <= start_00) goto LAB_0010bcaa;
    local_38 = 0;
    local_3c = 0;
    bVar3 = EatCodePoint(input,start_00,&local_38,&local_3c);
    start = local_38;
    bVar2 = bVar4;
  } while ((!bVar3) || (start = local_38, local_3c == 0));
  if (local_3c < 0x20) {
    start = local_38;
    if (local_3c != 10) goto LAB_0010bc40;
  }
  else {
    start = local_38;
    if (local_3c - 0x7f < 0x21) goto LAB_0010bc40;
  }
  bVar3 = IsCombining(local_3c);
  start = local_38;
  bVar2 = !bVar3 | bVar4;
  if ((!bVar3) && (start = local_38, uVar5 = start_00, !(bool)(bVar4 ^ 1))) {
LAB_0010bcaa:
    return (long)(int)uVar5;
  }
  goto LAB_0010bc40;
}

Assistant:

size_t GlyphNext(const std::string& input, size_t start) {
  bool glyph_found = false;
  while (start < input.size()) {
    size_t end = 0;
    uint32_t codepoint = 0;
    const bool eaten = EatCodePoint(input, start, &end, &codepoint);

    // Ignore invalid, control characters and combining characters.
    if (!eaten || IsControl(codepoint) || IsCombining(codepoint)) {
      start = end;
      continue;
    }

    // We eat the beginning of the next glyph. If we are eating the one
    // requested, return its start position immediately.
    if (glyph_found) {
      return static_cast<int>(start);
    }

    // Otherwise, skip this glyph and iterate:
    glyph_found = true;
    start = end;
  }
  return static_cast<int>(input.size());
}